

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  string *__return_storage_ptr__;
  cmLocalUnixMakefileGenerator3 *this_00;
  string *config;
  string local_d0;
  undefined1 local_b0 [8];
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string linkRuleVar_1;
  bool requiresDeviceLinking;
  cmMakefileLibraryTargetGenerator *this_local;
  
  linkRuleVar_1.field_2._M_local_buf[0xf] =
       requireDeviceLinking
                 ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                  GeneratorTarget,
                  (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                  &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName)
  ;
  if ((bool)linkRuleVar_1.field_2._M_local_buf[0xf]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",&local_39);
    std::allocator<char>::~allocator(&local_39);
    WriteDeviceLibraryRules(this,(string *)local_38,false);
    std::__cxx11::string::~string((string *)local_38);
  }
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  __return_storage_ptr__ = (string *)((long)&linkRuleVar.field_2 + 8);
  cmGeneratorTarget::GetLinkerLanguage
            (__return_storage_ptr__,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)((long)&extraFlags.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             __return_storage_ptr__,config);
  std::__cxx11::string::string((string *)local_b0);
  this_00 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmsys::SystemTools::UpperCase
            (&local_d0,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)this_00,(string *)local_b0,&local_d0,
             (string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_d0);
  WriteLibraryRules(this,(string *)((long)&extraFlags.field_2 + 8),(string *)local_b0,false);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(extraFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
  if (requiresDeviceLinking) {
    std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
    this->WriteDeviceLibraryRules(linkRuleVar, false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->ConfigName);

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, cmSystemTools::UpperCase(this->ConfigName), linkLanguage,
    this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}